

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

FunctionCall * __thiscall
soul::PoolAllocator::
allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
          (PoolAllocator *this,CodeLocation *args,pool_ptr<soul::heart::Expression> *args_1,
          Function *args_2)

{
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_65 [13];
  pool_ptr<soul::heart::Function> local_58;
  pool_ptr<soul::heart::Expression> local_50;
  CodeLocation local_48;
  FunctionCall *local_38;
  FunctionCall *newObject;
  PoolItem *newItem;
  Function *args_local_2;
  pool_ptr<soul::heart::Expression> *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (Function *)args_1;
  args_local_1 = (pool_ptr<soul::heart::Expression> *)args;
  args_local = (CodeLocation *)this;
  newObject = (FunctionCall *)allocateSpaceForObject(this,0x68);
  this_00 = &(newObject->super_Assignment).super_Statement.super_Object.location.location;
  CodeLocation::CodeLocation(&local_48,(CodeLocation *)args_local_1);
  local_50.object = (Expression *)(args_local_2->super_Object)._vptr_Object;
  pool_ptr<soul::heart::Function>::pool_ptr<soul::heart::Function,void>
            (&local_58,(Function *)newItem);
  heart::FunctionCall::FunctionCall((FunctionCall *)this_00,&local_48,&local_50,&local_58);
  pool_ptr<soul::heart::Function>::~pool_ptr(&local_58);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_50);
  CodeLocation::~CodeLocation(&local_48);
  local_38 = (FunctionCall *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation_const&,soul::pool_ptr&&,soul::heart::Function&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(local_65);
  (newObject->super_Assignment).super_Statement.super_Object.location.sourceCode.object = pSVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }